

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

int thread_pool_worker(void *data)

{
  work_queue *queue_00;
  long lVar1;
  size_t sVar2;
  work_item *pwVar3;
  _Bool _Var4;
  int iVar5;
  work_item *item;
  size_t thread_id;
  thread_pool *thread_pool;
  work_queue *queue;
  thread_data *thread_data;
  void *data_local;
  
  queue_00 = *(work_queue **)((long)data + 8);
  lVar1 = *data;
  sVar2 = *(size_t *)((long)data + 0x10);
  do {
    mtx_lock(&queue_00->mutex);
    while (queue_00->first_item == (work_item *)0x0) {
      if (((*(byte *)(lVar1 + 0x10) & 1) != 0) ||
         (iVar5 = cnd_wait(&queue_00->avail_cond,&queue_00->mutex), iVar5 != 0)) {
        mtx_unlock(&queue_00->mutex);
        return 0;
      }
    }
    pwVar3 = queue_00->first_item;
    queue_00->first_item = pwVar3->next;
    if (queue_00->first_item == (work_item *)0x0) {
      if (queue_00->last_item != pwVar3) {
        __assert_fail("queue->last_item == item",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0x4f,"int thread_pool_worker(void *)");
      }
      queue_00->last_item = (work_item *)0x0;
    }
    queue_00->worked_on = queue_00->worked_on + 1;
    mtx_unlock(&queue_00->mutex);
    (*pwVar3->work_fn)(pwVar3,sVar2);
    mtx_lock(&queue_00->mutex);
    pwVar3->next = queue_00->done_items;
    queue_00->done_items = pwVar3;
    queue_00->worked_on = queue_00->worked_on - 1;
    queue_00->done_count = queue_00->done_count + 1;
    _Var4 = waiting_condition(queue_00);
    if (!_Var4) {
      cnd_signal(&queue_00->done_cond);
    }
    mtx_unlock(&queue_00->mutex);
  } while( true );
}

Assistant:

static int thread_pool_worker(void* data) {
    struct thread_data* thread_data = data;
    struct work_queue* queue = thread_data->queue;
    struct thread_pool* thread_pool = thread_data->thread_pool;
    size_t thread_id = thread_data->thread_id;
    while (true) {
        mtx_lock(&queue->mutex);
        while (!queue->first_item) {
            if (thread_pool->should_stop || cnd_wait(&queue->avail_cond, &queue->mutex) != thrd_success)
                goto end;
        }
        struct work_item* item = queue->first_item;
        queue->first_item = item->next;
        if (!queue->first_item) {
            assert(queue->last_item == item);
            queue->last_item = NULL;
        }
        queue->worked_on++;
        mtx_unlock(&queue->mutex);

        item->work_fn(item, thread_id);

        mtx_lock(&queue->mutex);
        item->next = queue->done_items;
        queue->done_items = item;
        queue->worked_on--;
        queue->done_count++;
        if (!waiting_condition(queue))
            cnd_signal(&queue->done_cond);
        mtx_unlock(&queue->mutex);
    }
end:
    mtx_unlock(&queue->mutex);
    return 0;
}